

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::InvalidError::InvalidError(InvalidError *this,string *msg,ExitCodes exit_code)

{
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"InvalidError",&local_69)
  ;
  ::std::__cxx11::string::string((string *)&local_68,(string *)msg);
  ParseError::ParseError(&this->super_ParseError,&local_48,&local_68,exit_code);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&(this->super_ParseError).super_Error = &PTR__Error_00143368;
  return;
}

Assistant:

explicit InvalidError(std::string name)
        : InvalidError(name + ": Too many positional arguments with unlimited expected args", ExitCodes::InvalidError) {
    }